

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O2

void __thiscall PPU::incrementY(PPU *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  
  uVar2 = this->vramCur;
  if ((~uVar2 & 0x7000) == 0) {
    uVar3 = 0;
    uVar1 = uVar2 ^ 0x800;
    if ((uVar2 & 0x3e0) != 0x3a0) {
      uVar3 = uVar2 + 0x20 & 0x3e0;
      uVar1 = uVar2;
    }
    uVar2 = uVar1 & 0x8c1f | uVar3;
  }
  else {
    uVar2 = uVar2 + 0x1000;
  }
  this->vramCur = uVar2;
  return;
}

Assistant:

void PPU::incrementY() {
    if ((vramCur & 0x7000) == 0x7000) {
        vramCur &= ~0x7000;
        int y = (vramCur & 0x03E0) >> 5;
        if (y == 29) {
            y = 0;
            vramCur ^= 0x0800;
        } else {
            y = (y + 1) & 31;
        }
        vramCur = (vramCur & ~0x03E0) | (y << 5);
    } else {
        vramCur += 0x1000;
    }
}